

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

string * __thiscall pbrt::MitchellFilter::ToString_abi_cxx11_(MitchellFilter *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  float *in_stack_00000018;
  Vector2<float> *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::Vector2<float>const&,float_const&,float_const&,pbrt::FilterSampler_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
             (FilterSampler *)this);
  return in_RDI;
}

Assistant:

std::string MitchellFilter::ToString() const {
    return StringPrintf("[ MitchellFilter radius: %s B: %f C: %f sampler: %s ]", radius,
                        B, C, sampler);
}